

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::CodeHolder::attach(CodeHolder *this,CodeEmitter *emitter)

{
  Error EVar1;
  Assembler **ppAVar2;
  
  if (emitter == (CodeEmitter *)0x0) {
    return 3;
  }
  if (emitter->_type - 4 < 0xfffffffd) {
    EVar1 = 4;
  }
  else if (emitter->_code == (CodeHolder *)0x0) {
    if (emitter->_type == 1) {
      if (this->_cgAsm != (Assembler *)0x0) {
        return 9;
      }
      ppAVar2 = &this->_cgAsm;
    }
    else {
      ppAVar2 = (Assembler **)0x0;
    }
    EVar1 = (*emitter->_vptr_CodeEmitter[2])(emitter,this);
    if (EVar1 == 0) {
      emitter->_nextEmitter = this->_emitters;
      this->_emitters = emitter;
      if (ppAVar2 != (Assembler **)0x0) {
        *ppAVar2 = (Assembler *)emitter;
      }
      emitter->_code = this;
      EVar1 = 0;
    }
  }
  else {
    EVar1 = (uint)(emitter->_code != this) << 2;
  }
  return EVar1;
}

Assistant:

Error CodeHolder::attach(CodeEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (!emitter)
    return DebugUtils::errored(kErrorInvalidArgument);

  uint32_t type = emitter->getType();
  if (type == CodeEmitter::kTypeNone || type >= CodeEmitter::kTypeCount)
    return DebugUtils::errored(kErrorInvalidState);

  // This is suspicious, but don't fail if `emitter` matches.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this) return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Special case - attach `Assembler`.
  CodeEmitter** pSlot = nullptr;
  if (type == CodeEmitter::kTypeAssembler) {
    if (_cgAsm)
      return DebugUtils::errored(kErrorSlotOccupied);
    pSlot = reinterpret_cast<CodeEmitter**>(&_cgAsm);
  }

  Error err = emitter->onAttach(this);
  if (err != kErrorOk) return err;

  // Add to a single-linked list of `CodeEmitter`s.
  emitter->_nextEmitter = _emitters;
  _emitters = emitter;
  if (pSlot) *pSlot = emitter;

  // Establish the connection.
  emitter->_code = this;
  return kErrorOk;
}